

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha256_end(uchar *hval,sha256_ctx *ctx)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar4 = ctx->count[0];
  uVar3 = uVar4 & 0x3f;
  if (uVar3 != 0) {
    uVar6 = (ulong)((uVar4 & 0x3f) + 3 >> 2);
    do {
      uVar1 = ctx->hash[uVar6 + 7];
      ctx->hash[uVar6 + 7] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  uVar6 = (ulong)((uVar4 & 3) << 2);
  *(uint *)((long)ctx->wbuf + (ulong)(uVar4 & 0x3c)) =
       *(uint *)((long)m1 + uVar6) & *(uint *)((long)ctx->wbuf + (ulong)(uVar4 & 0x3c)) |
       *(uint *)((long)b1 + uVar6);
  if (uVar3 < 0x38) {
    uVar4 = (uVar3 >> 2) + 1;
  }
  else {
    if (uVar3 < 0x3c) {
      ctx->wbuf[0xf] = 0;
    }
    sha256_compile(ctx);
    uVar4 = 0;
  }
  if (uVar4 < 0xe) {
    memset(ctx->wbuf + uVar4,0,(ulong)(0xd - uVar4) * 4 + 4);
  }
  uVar4 = ctx->count[0];
  ctx->wbuf[0xe] = ctx->count[1] << 3 | uVar4 >> 0x1d;
  ctx->wbuf[0xf] = uVar4 << 3;
  sha256_compile(ctx);
  bVar2 = 0;
  lVar5 = 0;
  do {
    hval[lVar5] = (uchar)(*(uint *)((long)ctx->hash + (ulong)((uint)lVar5 & 0xfffffffc)) >>
                         (~bVar2 & 0x18));
    lVar5 = lVar5 + 1;
    bVar2 = bVar2 + 8;
  } while (lVar5 != 0x20);
  return;
}

Assistant:

void sha256_end(unsigned char hval[], sha256_ctx ctx[1])
{   sha2_32t    i = (sha2_32t)(ctx->count[0] & SHA256_MASK);

        bsw_32(ctx->wbuf, (i + 3) >> 2)
    /* bytes in the buffer are now in an order in which references  */
    /* to 32-bit words will put bytes with lower addresses into the */
    /* top of 32 bit words on BOTH big and little endian machines   */
    
    /* we now need to mask valid bytes and add the padding which is */
    /* a single 1 bit and as many zero bits as necessary.           */
    ctx->wbuf[i >> 2] = (ctx->wbuf[i >> 2] & m1[i & 3]) | b1[i & 3];

    /* we need 9 or more empty positions, one for the padding byte  */
    /* (above) and eight for the length count.  If there is not     */
    /* enough space pad and empty the buffer                        */
    if(i > SHA256_BLOCK_SIZE - 9)
    {
        if(i < 60) ctx->wbuf[15] = 0;
        sha256_compile(ctx);
        i = 0;
    }
    else    /* compute a word index for the empty buffer positions  */
        i = (i >> 2) + 1;

    while(i < 14) /* and zero pad all but last two positions      */ 
        ctx->wbuf[i++] = 0;
    
    /* the following 32-bit length fields are assembled in the      */
    /* wrong byte order on little endian machines but this is       */
    /* corrected later since they are only ever used as 32-bit      */
    /* word values.                                                 */

    ctx->wbuf[14] = (ctx->count[1] << 3) | (ctx->count[0] >> 29);
    ctx->wbuf[15] = ctx->count[0] << 3;

    sha256_compile(ctx);

    /* extract the hash value as bytes in case the hash buffer is   */
    /* mislaigned for 32-bit words                                  */
    for(i = 0; i < SHA256_DIGEST_SIZE; ++i)
        hval[i] = (unsigned char)(ctx->hash[i >> 2] >> 8 * (~i & 3));
}